

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O3

QSize __thiscall QMdiArea::sizeHint(QMdiArea *this)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  QMdiSubWindow *child;
  long lVar10;
  
  lVar7 = *(long *)(*(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8
                   + 0x10);
  if (lVar7 == 0) {
    iVar9 = 3;
  }
  else {
    iVar9 = 0;
    do {
      lVar3 = QMetaObject::cast((QObject *)&staticMetaObject);
      iVar9 = (iVar9 + 1) - (uint)(lVar3 == 0);
      lVar7 = *(long *)(*(long *)(lVar7 + 8) + 0x10);
    } while (lVar7 != 0);
    iVar9 = iVar9 * 3 + 3;
  }
  QGuiApplication::primaryScreen();
  uVar4 = QScreen::virtualSize();
  uVar8 = (long)((int)uVar4 * 2) / (long)iVar9 & 0xffffffff;
  uVar4 = (long)((long)(int)(uVar4 >> 0x1f) & 0xfffffffffffffffeU) / (long)iVar9 & 0xffffffff;
  lVar7 = *(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  lVar3 = *(long *)(lVar7 + 0x368);
  if (lVar3 != 0) {
    lVar7 = *(long *)(lVar7 + 0x360);
    lVar10 = 0;
    do {
      lVar1 = *(long *)(lVar7 + lVar10);
      if ((lVar1 == 0) || (*(int *)(lVar1 + 4) == 0)) {
        child = (QMdiSubWindow *)0x0;
      }
      else {
        child = *(QMdiSubWindow **)(lVar7 + 8 + lVar10);
      }
      bVar2 = sanityCheck(child,"QMdiArea::sizeHint");
      if (bVar2) {
        uVar5 = (**(code **)(*(long *)&child->super_QWidget + 0x70))(child);
        if ((int)uVar8 <= (int)uVar5) {
          uVar8 = uVar5 & 0xffffffff;
        }
        uVar6 = (uint)(uVar5 >> 0x20);
        if ((int)uVar6 < (int)(uint)uVar4) {
          uVar6 = (uint)uVar4;
        }
        uVar4 = (ulong)uVar6;
      }
      lVar10 = lVar10 + 0x10;
    } while (lVar3 << 4 != lVar10);
  }
  return (QSize)(uVar8 | uVar4 << 0x20);
}

Assistant:

QSize QMdiArea::sizeHint() const
{
    // Calculate a proper scale factor for the desktop's size.
    // This also takes into account that we can have nested workspaces.
    int nestedCount = 0;
    QWidget *widget = this->parentWidget();
    while (widget) {
        if (qobject_cast<QMdiArea *>(widget))
            ++nestedCount;
        widget = widget->parentWidget();
    }
    const int scaleFactor = 3 * (nestedCount + 1);

    QSize desktopSize = QGuiApplication::primaryScreen()->virtualSize();
    QSize size(desktopSize.width() * 2 / scaleFactor, desktopSize.height() * 2 / scaleFactor);
    for (QMdiSubWindow *child : d_func()->childWindows) {
        if (!sanityCheck(child, "QMdiArea::sizeHint"))
            continue;
        size = size.expandedTo(child->sizeHint());
    }
    return size;
}